

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_tokenizer.c
# Opt level: O2

int STRING_TOKENIZER_get_next_token
              (STRING_TOKENIZER_HANDLE tokenizer,STRING_HANDLE output,char *delimiters)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  LOGGER_LOG p_Var5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  size_t sVar9;
  ulong uVar10;
  char *pcVar11;
  
  if (delimiters == (char *)0x0 ||
      (output == (STRING_HANDLE)0x0 || tokenizer == (STRING_TOKENIZER_HANDLE)0x0)) {
    iVar1 = 0x4b;
  }
  else {
    pcVar8 = tokenizer->inputString;
    pcVar11 = tokenizer->currentPos;
    sVar9 = tokenizer->sizeOfinputString;
    sVar2 = strlen(delimiters);
    pcVar8 = pcVar8 + (sVar9 - (long)pcVar11);
    if (pcVar8 == (char *)0x0) {
      iVar1 = 0x58;
    }
    else {
      if (sVar2 == 0) {
        p_Var5 = xlogging_get_log_function();
        iVar1 = 0x5d;
        if (p_Var5 == (LOGGER_LOG)0x0) {
          return 0x5d;
        }
        pcVar8 = "Empty delimiters parameter.";
        iVar6 = 0x5c;
      }
      else {
        for (pcVar3 = (char *)0x0; pcVar4 = pcVar8, pcVar3 != pcVar8; pcVar3 = pcVar3 + 1) {
          sVar7 = 0;
          do {
            pcVar4 = pcVar3;
            if (sVar2 == sVar7) goto LAB_00160892;
            pcVar4 = delimiters + sVar7;
            sVar7 = sVar7 + 1;
          } while (pcVar11[(long)pcVar3] != *pcVar4);
        }
LAB_00160892:
        pcVar11 = pcVar11 + (long)pcVar4;
        tokenizer->currentPos = pcVar11;
        sVar9 = (long)pcVar8 - (long)pcVar4;
        if (sVar9 == 0) {
          return 0x82;
        }
        uVar10 = 0xffffffffffffffff;
        do {
          if (uVar10 - sVar2 == -1) {
            uVar10 = 0;
            goto LAB_001608f1;
          }
          pcVar8 = strchr(pcVar11,(int)delimiters[uVar10 + 1]);
          uVar10 = uVar10 + 1;
        } while (pcVar8 == (char *)0x0);
        uVar10 = (ulong)(uVar10 < sVar2);
        sVar9 = (long)pcVar8 - (long)pcVar11;
LAB_001608f1:
        iVar1 = STRING_copy_n(output,pcVar11,sVar9);
        if (iVar1 == 0) {
          tokenizer->currentPos = tokenizer->currentPos + uVar10 + sVar9;
          return 0;
        }
        p_Var5 = xlogging_get_log_function();
        iVar1 = 0xa5;
        if (p_Var5 == (LOGGER_LOG)0x0) {
          return 0xa5;
        }
        pcVar8 = "Problem copying token to output String.";
        iVar6 = 0xa4;
      }
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/string_tokenizer.c"
                ,"STRING_TOKENIZER_get_next_token",iVar6,1,pcVar8);
    }
  }
  return iVar1;
}

Assistant:

int STRING_TOKENIZER_get_next_token(STRING_TOKENIZER_HANDLE tokenizer, STRING_HANDLE output, const char* delimiters)
{
    int result;
    /* Codes_SRS_STRING_04_004: [STRING_TOKENIZER_get_next_token shall return a nonzero value if any of the 3 parameters is NULL] */
    if (tokenizer == NULL || output == NULL || delimiters == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        STRING_TOKEN* token = (STRING_TOKEN*)tokenizer;
        /* Codes_SRS_STRING_04_011: [Each subsequent call to STRING_TOKENIZER_get_next_token starts searching from the saved position on t and behaves as described above.] */
        size_t remainingInputStringSize = token->sizeOfinputString - (token->currentPos - token->inputString);
        size_t delimitterSize = strlen(delimiters);

        /* First Check if we reached the end of the string*/
        /* Codes_SRS_STRING_TOKENIZER_04_014: [STRING_TOKENIZER_get_next_token shall return nonzero value if t contains an empty string.] */
        if (remainingInputStringSize == 0)
        {
            result = MU_FAILURE;
        }
        else if (delimitterSize == 0)
        {
            LogError("Empty delimiters parameter.");
            result = MU_FAILURE;
        }
        else
        {
            size_t i;
            /* Codes_SRS_STRING_04_005: [STRING_TOKENIZER_get_next_token searches the string inside STRING_TOKENIZER_HANDLE for the first character that is NOT contained in the current delimiter] */
            for (i = 0; i < remainingInputStringSize; i++)
            {
                size_t j;

                bool foundDelimitter = false;
                for (j = 0; j < delimitterSize; j++)
                {
                    if (token->currentPos[i] == delimiters[j])
                    {
                        foundDelimitter = true;
                        break;
                    }
                }

                /* Codes_SRS_STRING_04_007: [If such a character is found, STRING_TOKENIZER_get_next_token consider it as the start of a token.] */
                if (!foundDelimitter)
                {
                    break;
                }
            }

            /* Codes_SRS_STRING_04_006: [If no such character is found, then STRING_TOKENIZER_get_next_token shall return a nonzero Value (You've reach the end of the string or the string consists with only delimiters).] */
            //At this point update Current Pos to the character of the last token found or end of String.
            token->currentPos += i;

            //Update the remainingInputStringSize
            remainingInputStringSize -= i;

            /* Codes_SRS_STRING_04_006: [If no such character is found, then STRING_TOKENIZER_get_next_token shall return a nonzero Value (You've reach the end of the string or the string consists with only delimiters).] */
            if (remainingInputStringSize == 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                bool foundDelimitter = false;
                const char* endOfTokenPosition=NULL;
                size_t amountOfCharactersToCopy;
                size_t j;
                //At this point the Current Pos is pointing to a character that is point to a nonDelimiter. So, now search for a Delimiter, till the end of the String.
                /*Codes_SRS_STRING_04_008: [STRING_TOKENIZER_get_next_token than searches from the start of a token for a character that is contained in the delimiters string.] */
                /* Codes_SRS_STRING_04_009: [If no such character is found, STRING_TOKENIZER_get_next_token extends the current token to the end of the string inside t, copies the token to output and returns 0.] */
                /* Codes_SRS_STRING_04_010: [If such a character is found, STRING_TOKENIZER_get_next_token consider it the end of the token and copy it's content to output, updates the current position inside t to the next character and returns 0.] */
                for (j = 0; j < delimitterSize; j++)
                {
                    if ((endOfTokenPosition = strchr(token->currentPos, delimiters[j])) != NULL)
                    {
                        foundDelimitter = true;
                        break;
                    }
                }

                //If token not found, than update the EndOfToken to the end of the inputString;
                if (endOfTokenPosition == NULL)
                {
                    amountOfCharactersToCopy = remainingInputStringSize;
                }
                else
                {
                    amountOfCharactersToCopy = endOfTokenPosition - token->currentPos;
                }

                //copy here the string to output.
                if (STRING_copy_n(output, token->currentPos, amountOfCharactersToCopy) != 0)
                {
                    LogError("Problem copying token to output String.");
                    result = MU_FAILURE;
                }
                else
                {
                    //Update the Current position.
                    //Check if end of String reached so, currentPos points to the end of String.
                    if (foundDelimitter)
                    {
                        token->currentPos += amountOfCharactersToCopy + 1;
                    }
                    else
                    {
                        token->currentPos += amountOfCharactersToCopy;
                    }

                    result = 0; //Result will be on the output.
                }
            }
        }
    }

    return result;
}